

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O0

OPJ_BOOL bmp_read_info_header(FILE *IN,OPJ_BITMAPINFOHEADER *header)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  OPJ_BITMAPINFOHEADER *header_local;
  FILE *IN_local;
  
  header->biIntent = 0;
  header->biIccProfileData = 0;
  header->biIccProfileSize = 0;
  header->biReserved = 0;
  header->biRedGamma = 0;
  header->biGreenGamma = 0;
  header->biBlueGamma = 0;
  header->biIntent = 0;
  header->biColorSpaceEP[0x14] = '\0';
  header->biColorSpaceEP[0x15] = '\0';
  header->biColorSpaceEP[0x16] = '\0';
  header->biColorSpaceEP[0x17] = '\0';
  header->biColorSpaceEP[0x18] = '\0';
  header->biColorSpaceEP[0x19] = '\0';
  header->biColorSpaceEP[0x1a] = '\0';
  header->biColorSpaceEP[0x1b] = '\0';
  header->biColorSpaceEP[0x1c] = '\0';
  header->biColorSpaceEP[0x1d] = '\0';
  header->biColorSpaceEP[0x1e] = '\0';
  header->biColorSpaceEP[0x1f] = '\0';
  header->biColorSpaceEP[0x20] = '\0';
  header->biColorSpaceEP[0x21] = '\0';
  header->biColorSpaceEP[0x22] = '\0';
  header->biColorSpaceEP[0x23] = '\0';
  header->biColorSpaceEP[4] = '\0';
  header->biColorSpaceEP[5] = '\0';
  header->biColorSpaceEP[6] = '\0';
  header->biColorSpaceEP[7] = '\0';
  header->biColorSpaceEP[8] = '\0';
  header->biColorSpaceEP[9] = '\0';
  header->biColorSpaceEP[10] = '\0';
  header->biColorSpaceEP[0xb] = '\0';
  header->biColorSpaceEP[0xc] = '\0';
  header->biColorSpaceEP[0xd] = '\0';
  header->biColorSpaceEP[0xe] = '\0';
  header->biColorSpaceEP[0xf] = '\0';
  header->biColorSpaceEP[0x10] = '\0';
  header->biColorSpaceEP[0x11] = '\0';
  header->biColorSpaceEP[0x12] = '\0';
  header->biColorSpaceEP[0x13] = '\0';
  header->biBlueMask = 0;
  header->biAlphaMask = 0;
  header->biColorSpaceType = 0;
  header->biColorSpaceEP[0] = '\0';
  header->biColorSpaceEP[1] = '\0';
  header->biColorSpaceEP[2] = '\0';
  header->biColorSpaceEP[3] = '\0';
  header->biClrUsed = 0;
  header->biClrImportant = 0;
  header->biRedMask = 0;
  header->biGreenMask = 0;
  header->biCompression = 0;
  header->biSizeImage = 0;
  header->biXpelsPerMeter = 0;
  header->biYpelsPerMeter = 0;
  header->biSize = 0;
  header->biWidth = 0;
  header->biHeight = 0;
  header->biPlanes = 0;
  header->biBitCount = 0;
  OVar1 = getc((FILE *)IN);
  header->biSize = OVar1;
  iVar2 = getc((FILE *)IN);
  header->biSize = header->biSize | iVar2 << 8;
  iVar2 = getc((FILE *)IN);
  header->biSize = header->biSize | iVar2 << 0x10;
  iVar2 = getc((FILE *)IN);
  header->biSize = header->biSize | iVar2 << 0x18;
  OVar1 = header->biSize;
  if ((((OVar1 == 0xc) || (OVar1 == 0x28)) || (OVar1 == 0x34)) ||
     (((OVar1 == 0x38 || (OVar1 == 0x6c)) || (OVar1 == 0x7c)))) {
    OVar1 = getc((FILE *)IN);
    header->biWidth = OVar1;
    iVar2 = getc((FILE *)IN);
    header->biWidth = iVar2 << 8 | header->biWidth;
    iVar2 = getc((FILE *)IN);
    header->biWidth = iVar2 << 0x10 | header->biWidth;
    iVar2 = getc((FILE *)IN);
    header->biWidth = iVar2 << 0x18 | header->biWidth;
    OVar1 = getc((FILE *)IN);
    header->biHeight = OVar1;
    iVar2 = getc((FILE *)IN);
    header->biHeight = iVar2 << 8 | header->biHeight;
    iVar2 = getc((FILE *)IN);
    header->biHeight = iVar2 << 0x10 | header->biHeight;
    iVar2 = getc((FILE *)IN);
    header->biHeight = iVar2 << 0x18 | header->biHeight;
    iVar2 = getc((FILE *)IN);
    header->biPlanes = (OPJ_UINT16)iVar2;
    iVar2 = getc((FILE *)IN);
    header->biPlanes = header->biPlanes | (ushort)(iVar2 << 8);
    iVar2 = getc((FILE *)IN);
    header->biBitCount = (OPJ_UINT16)iVar2;
    uVar3 = getc((FILE *)IN);
    header->biBitCount = header->biBitCount | (ushort)((uVar3 & 0xff) << 8);
    if (header->biBitCount == 0) {
      fprintf(_stderr,"Error, invalid biBitCount %d\n",0);
      IN_local._4_4_ = 0;
    }
    else {
      if (0x27 < header->biSize) {
        OVar1 = getc((FILE *)IN);
        header->biCompression = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biCompression = iVar2 << 8 | header->biCompression;
        iVar2 = getc((FILE *)IN);
        header->biCompression = iVar2 << 0x10 | header->biCompression;
        iVar2 = getc((FILE *)IN);
        header->biCompression = iVar2 << 0x18 | header->biCompression;
        OVar1 = getc((FILE *)IN);
        header->biSizeImage = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biSizeImage = iVar2 << 8 | header->biSizeImage;
        iVar2 = getc((FILE *)IN);
        header->biSizeImage = iVar2 << 0x10 | header->biSizeImage;
        iVar2 = getc((FILE *)IN);
        header->biSizeImage = iVar2 << 0x18 | header->biSizeImage;
        OVar1 = getc((FILE *)IN);
        header->biXpelsPerMeter = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biXpelsPerMeter = iVar2 << 8 | header->biXpelsPerMeter;
        iVar2 = getc((FILE *)IN);
        header->biXpelsPerMeter = iVar2 << 0x10 | header->biXpelsPerMeter;
        iVar2 = getc((FILE *)IN);
        header->biXpelsPerMeter = iVar2 << 0x18 | header->biXpelsPerMeter;
        OVar1 = getc((FILE *)IN);
        header->biYpelsPerMeter = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biYpelsPerMeter = iVar2 << 8 | header->biYpelsPerMeter;
        iVar2 = getc((FILE *)IN);
        header->biYpelsPerMeter = iVar2 << 0x10 | header->biYpelsPerMeter;
        iVar2 = getc((FILE *)IN);
        header->biYpelsPerMeter = iVar2 << 0x18 | header->biYpelsPerMeter;
        OVar1 = getc((FILE *)IN);
        header->biClrUsed = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biClrUsed = iVar2 << 8 | header->biClrUsed;
        iVar2 = getc((FILE *)IN);
        header->biClrUsed = iVar2 << 0x10 | header->biClrUsed;
        iVar2 = getc((FILE *)IN);
        header->biClrUsed = iVar2 << 0x18 | header->biClrUsed;
        OVar1 = getc((FILE *)IN);
        header->biClrImportant = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biClrImportant = iVar2 << 8 | header->biClrImportant;
        iVar2 = getc((FILE *)IN);
        header->biClrImportant = iVar2 << 0x10 | header->biClrImportant;
        iVar2 = getc((FILE *)IN);
        header->biClrImportant = iVar2 << 0x18 | header->biClrImportant;
      }
      if (0x37 < header->biSize) {
        OVar1 = getc((FILE *)IN);
        header->biRedMask = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biRedMask = iVar2 << 8 | header->biRedMask;
        iVar2 = getc((FILE *)IN);
        header->biRedMask = iVar2 << 0x10 | header->biRedMask;
        iVar2 = getc((FILE *)IN);
        header->biRedMask = iVar2 << 0x18 | header->biRedMask;
        if (header->biRedMask == 0) {
          fprintf(_stderr,"Error, invalid red mask value %d\n",(ulong)header->biRedMask);
          return 0;
        }
        OVar1 = getc((FILE *)IN);
        header->biGreenMask = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biGreenMask = iVar2 << 8 | header->biGreenMask;
        iVar2 = getc((FILE *)IN);
        header->biGreenMask = iVar2 << 0x10 | header->biGreenMask;
        iVar2 = getc((FILE *)IN);
        header->biGreenMask = iVar2 << 0x18 | header->biGreenMask;
        if (header->biGreenMask == 0) {
          fprintf(_stderr,"Error, invalid green mask value %d\n",(ulong)header->biGreenMask);
          return 0;
        }
        OVar1 = getc((FILE *)IN);
        header->biBlueMask = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biBlueMask = iVar2 << 8 | header->biBlueMask;
        iVar2 = getc((FILE *)IN);
        header->biBlueMask = iVar2 << 0x10 | header->biBlueMask;
        iVar2 = getc((FILE *)IN);
        header->biBlueMask = iVar2 << 0x18 | header->biBlueMask;
        if (header->biBlueMask == 0) {
          fprintf(_stderr,"Error, invalid blue mask value %d\n",(ulong)header->biBlueMask);
          return 0;
        }
        OVar1 = getc((FILE *)IN);
        header->biAlphaMask = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biAlphaMask = iVar2 << 8 | header->biAlphaMask;
        iVar2 = getc((FILE *)IN);
        header->biAlphaMask = iVar2 << 0x10 | header->biAlphaMask;
        iVar2 = getc((FILE *)IN);
        header->biAlphaMask = iVar2 << 0x18 | header->biAlphaMask;
      }
      if (0x6b < header->biSize) {
        OVar1 = getc((FILE *)IN);
        header->biColorSpaceType = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biColorSpaceType = iVar2 << 8 | header->biColorSpaceType;
        iVar2 = getc((FILE *)IN);
        header->biColorSpaceType = iVar2 << 0x10 | header->biColorSpaceType;
        iVar2 = getc((FILE *)IN);
        header->biColorSpaceType = iVar2 << 0x18 | header->biColorSpaceType;
        sVar4 = fread(header->biColorSpaceEP,1,0x24,(FILE *)IN);
        if (sVar4 != 0x24) {
          fprintf(_stderr,"Error, can\'t  read BMP header\n");
          return 0;
        }
        OVar1 = getc((FILE *)IN);
        header->biRedGamma = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biRedGamma = iVar2 << 8 | header->biRedGamma;
        iVar2 = getc((FILE *)IN);
        header->biRedGamma = iVar2 << 0x10 | header->biRedGamma;
        iVar2 = getc((FILE *)IN);
        header->biRedGamma = iVar2 << 0x18 | header->biRedGamma;
        OVar1 = getc((FILE *)IN);
        header->biGreenGamma = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biGreenGamma = iVar2 << 8 | header->biGreenGamma;
        iVar2 = getc((FILE *)IN);
        header->biGreenGamma = iVar2 << 0x10 | header->biGreenGamma;
        iVar2 = getc((FILE *)IN);
        header->biGreenGamma = iVar2 << 0x18 | header->biGreenGamma;
        OVar1 = getc((FILE *)IN);
        header->biBlueGamma = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biBlueGamma = iVar2 << 8 | header->biBlueGamma;
        iVar2 = getc((FILE *)IN);
        header->biBlueGamma = iVar2 << 0x10 | header->biBlueGamma;
        iVar2 = getc((FILE *)IN);
        header->biBlueGamma = iVar2 << 0x18 | header->biBlueGamma;
      }
      if (0x7b < header->biSize) {
        OVar1 = getc((FILE *)IN);
        header->biIntent = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biIntent = iVar2 << 8 | header->biIntent;
        iVar2 = getc((FILE *)IN);
        header->biIntent = iVar2 << 0x10 | header->biIntent;
        iVar2 = getc((FILE *)IN);
        header->biIntent = iVar2 << 0x18 | header->biIntent;
        OVar1 = getc((FILE *)IN);
        header->biIccProfileData = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biIccProfileData = iVar2 << 8 | header->biIccProfileData;
        iVar2 = getc((FILE *)IN);
        header->biIccProfileData = iVar2 << 0x10 | header->biIccProfileData;
        iVar2 = getc((FILE *)IN);
        header->biIccProfileData = iVar2 << 0x18 | header->biIccProfileData;
        OVar1 = getc((FILE *)IN);
        header->biIccProfileSize = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biIccProfileSize = iVar2 << 8 | header->biIccProfileSize;
        iVar2 = getc((FILE *)IN);
        header->biIccProfileSize = iVar2 << 0x10 | header->biIccProfileSize;
        iVar2 = getc((FILE *)IN);
        header->biIccProfileSize = iVar2 << 0x18 | header->biIccProfileSize;
        OVar1 = getc((FILE *)IN);
        header->biReserved = OVar1;
        iVar2 = getc((FILE *)IN);
        header->biReserved = iVar2 << 8 | header->biReserved;
        iVar2 = getc((FILE *)IN);
        header->biReserved = iVar2 << 0x10 | header->biReserved;
        iVar2 = getc((FILE *)IN);
        header->biReserved = iVar2 << 0x18 | header->biReserved;
      }
      IN_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"Error, unknown BMP header size %d\n",(ulong)header->biSize);
    IN_local._4_4_ = 0;
  }
  return IN_local._4_4_;
}

Assistant:

static OPJ_BOOL bmp_read_info_header(FILE* IN, OPJ_BITMAPINFOHEADER* header)
{
    memset(header, 0, sizeof(*header));
    /* INFO HEADER */
    /* ------------- */
    header->biSize  = (OPJ_UINT32)getc(IN);
    header->biSize |= (OPJ_UINT32)getc(IN) << 8;
    header->biSize |= (OPJ_UINT32)getc(IN) << 16;
    header->biSize |= (OPJ_UINT32)getc(IN) << 24;

    switch (header->biSize) {
    case 12U:  /* BITMAPCOREHEADER */
    case 40U:  /* BITMAPINFOHEADER */
    case 52U:  /* BITMAPV2INFOHEADER */
    case 56U:  /* BITMAPV3INFOHEADER */
    case 108U: /* BITMAPV4HEADER */
    case 124U: /* BITMAPV5HEADER */
        break;
    default:
        fprintf(stderr, "Error, unknown BMP header size %d\n", header->biSize);
        return OPJ_FALSE;
    }

    header->biWidth  = (OPJ_UINT32)getc(IN);
    header->biWidth |= (OPJ_UINT32)getc(IN) << 8;
    header->biWidth |= (OPJ_UINT32)getc(IN) << 16;
    header->biWidth |= (OPJ_UINT32)getc(IN) << 24;

    header->biHeight  = (OPJ_UINT32)getc(IN);
    header->biHeight |= (OPJ_UINT32)getc(IN) << 8;
    header->biHeight |= (OPJ_UINT32)getc(IN) << 16;
    header->biHeight |= (OPJ_UINT32)getc(IN) << 24;

    header->biPlanes  = (OPJ_UINT16)getc(IN);
    header->biPlanes |= (OPJ_UINT16)((OPJ_UINT32)getc(IN) << 8);

    header->biBitCount  = (OPJ_UINT16)getc(IN);
    header->biBitCount |= (OPJ_UINT16)((OPJ_UINT32)getc(IN) << 8);
    if (header->biBitCount == 0) {
        fprintf(stderr, "Error, invalid biBitCount %d\n", 0);
        return OPJ_FALSE;
    }

    if (header->biSize >= 40U) {
        header->biCompression  = (OPJ_UINT32)getc(IN);
        header->biCompression |= (OPJ_UINT32)getc(IN) << 8;
        header->biCompression |= (OPJ_UINT32)getc(IN) << 16;
        header->biCompression |= (OPJ_UINT32)getc(IN) << 24;

        header->biSizeImage  = (OPJ_UINT32)getc(IN);
        header->biSizeImage |= (OPJ_UINT32)getc(IN) << 8;
        header->biSizeImage |= (OPJ_UINT32)getc(IN) << 16;
        header->biSizeImage |= (OPJ_UINT32)getc(IN) << 24;

        header->biXpelsPerMeter  = (OPJ_UINT32)getc(IN);
        header->biXpelsPerMeter |= (OPJ_UINT32)getc(IN) << 8;
        header->biXpelsPerMeter |= (OPJ_UINT32)getc(IN) << 16;
        header->biXpelsPerMeter |= (OPJ_UINT32)getc(IN) << 24;

        header->biYpelsPerMeter  = (OPJ_UINT32)getc(IN);
        header->biYpelsPerMeter |= (OPJ_UINT32)getc(IN) << 8;
        header->biYpelsPerMeter |= (OPJ_UINT32)getc(IN) << 16;
        header->biYpelsPerMeter |= (OPJ_UINT32)getc(IN) << 24;

        header->biClrUsed  = (OPJ_UINT32)getc(IN);
        header->biClrUsed |= (OPJ_UINT32)getc(IN) << 8;
        header->biClrUsed |= (OPJ_UINT32)getc(IN) << 16;
        header->biClrUsed |= (OPJ_UINT32)getc(IN) << 24;

        header->biClrImportant  = (OPJ_UINT32)getc(IN);
        header->biClrImportant |= (OPJ_UINT32)getc(IN) << 8;
        header->biClrImportant |= (OPJ_UINT32)getc(IN) << 16;
        header->biClrImportant |= (OPJ_UINT32)getc(IN) << 24;
    }

    if (header->biSize >= 56U) {
        header->biRedMask  = (OPJ_UINT32)getc(IN);
        header->biRedMask |= (OPJ_UINT32)getc(IN) << 8;
        header->biRedMask |= (OPJ_UINT32)getc(IN) << 16;
        header->biRedMask |= (OPJ_UINT32)getc(IN) << 24;

        if (!header->biRedMask) {
            fprintf(stderr, "Error, invalid red mask value %d\n", header->biRedMask);
            return OPJ_FALSE;
        }

        header->biGreenMask  = (OPJ_UINT32)getc(IN);
        header->biGreenMask |= (OPJ_UINT32)getc(IN) << 8;
        header->biGreenMask |= (OPJ_UINT32)getc(IN) << 16;
        header->biGreenMask |= (OPJ_UINT32)getc(IN) << 24;

        if (!header->biGreenMask) {
            fprintf(stderr, "Error, invalid green mask value %d\n", header->biGreenMask);
            return OPJ_FALSE;
        }

        header->biBlueMask  = (OPJ_UINT32)getc(IN);
        header->biBlueMask |= (OPJ_UINT32)getc(IN) << 8;
        header->biBlueMask |= (OPJ_UINT32)getc(IN) << 16;
        header->biBlueMask |= (OPJ_UINT32)getc(IN) << 24;

        if (!header->biBlueMask) {
            fprintf(stderr, "Error, invalid blue mask value %d\n", header->biBlueMask);
            return OPJ_FALSE;
        }

        header->biAlphaMask  = (OPJ_UINT32)getc(IN);
        header->biAlphaMask |= (OPJ_UINT32)getc(IN) << 8;
        header->biAlphaMask |= (OPJ_UINT32)getc(IN) << 16;
        header->biAlphaMask |= (OPJ_UINT32)getc(IN) << 24;
    }

    if (header->biSize >= 108U) {
        header->biColorSpaceType  = (OPJ_UINT32)getc(IN);
        header->biColorSpaceType |= (OPJ_UINT32)getc(IN) << 8;
        header->biColorSpaceType |= (OPJ_UINT32)getc(IN) << 16;
        header->biColorSpaceType |= (OPJ_UINT32)getc(IN) << 24;

        if (fread(&(header->biColorSpaceEP), 1U, sizeof(header->biColorSpaceEP),
                  IN) != sizeof(header->biColorSpaceEP)) {
            fprintf(stderr, "Error, can't  read BMP header\n");
            return OPJ_FALSE;
        }

        header->biRedGamma  = (OPJ_UINT32)getc(IN);
        header->biRedGamma |= (OPJ_UINT32)getc(IN) << 8;
        header->biRedGamma |= (OPJ_UINT32)getc(IN) << 16;
        header->biRedGamma |= (OPJ_UINT32)getc(IN) << 24;

        header->biGreenGamma  = (OPJ_UINT32)getc(IN);
        header->biGreenGamma |= (OPJ_UINT32)getc(IN) << 8;
        header->biGreenGamma |= (OPJ_UINT32)getc(IN) << 16;
        header->biGreenGamma |= (OPJ_UINT32)getc(IN) << 24;

        header->biBlueGamma  = (OPJ_UINT32)getc(IN);
        header->biBlueGamma |= (OPJ_UINT32)getc(IN) << 8;
        header->biBlueGamma |= (OPJ_UINT32)getc(IN) << 16;
        header->biBlueGamma |= (OPJ_UINT32)getc(IN) << 24;
    }

    if (header->biSize >= 124U) {
        header->biIntent  = (OPJ_UINT32)getc(IN);
        header->biIntent |= (OPJ_UINT32)getc(IN) << 8;
        header->biIntent |= (OPJ_UINT32)getc(IN) << 16;
        header->biIntent |= (OPJ_UINT32)getc(IN) << 24;

        header->biIccProfileData  = (OPJ_UINT32)getc(IN);
        header->biIccProfileData |= (OPJ_UINT32)getc(IN) << 8;
        header->biIccProfileData |= (OPJ_UINT32)getc(IN) << 16;
        header->biIccProfileData |= (OPJ_UINT32)getc(IN) << 24;

        header->biIccProfileSize  = (OPJ_UINT32)getc(IN);
        header->biIccProfileSize |= (OPJ_UINT32)getc(IN) << 8;
        header->biIccProfileSize |= (OPJ_UINT32)getc(IN) << 16;
        header->biIccProfileSize |= (OPJ_UINT32)getc(IN) << 24;

        header->biReserved  = (OPJ_UINT32)getc(IN);
        header->biReserved |= (OPJ_UINT32)getc(IN) << 8;
        header->biReserved |= (OPJ_UINT32)getc(IN) << 16;
        header->biReserved |= (OPJ_UINT32)getc(IN) << 24;
    }
    return OPJ_TRUE;
}